

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall cfd::core::ByteData::Push(ByteData *this,ByteData160 *back_insert_data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> insert_bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,
             &back_insert_data->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (size_type)
             ((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              (long)local_28._M_impl.super__Vector_impl_data._M_finish +
             (8 - (long)(local_28._M_impl.super__Vector_impl_data._M_start +
                        (long)(this->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start))));
  ::std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (local_28._M_impl.super__Vector_impl_data._M_start,
             local_28._M_impl.super__Vector_impl_data._M_finish,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)this
            );
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  return;
}

Assistant:

void ByteData::Push(const ByteData160& back_insert_data) {
  std::vector<uint8_t> insert_bytes = back_insert_data.GetBytes();
  data_.reserve(data_.size() + insert_bytes.size() + 8);
  std::copy(
      insert_bytes.begin(), insert_bytes.end(), std::back_inserter(data_));
}